

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

void Gia_ManPrintStatsClasses(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int nLits;
  int Proved;
  int CounterX;
  int Counter0;
  int Counter;
  int i;
  Gia_Man_t *p_local;
  
  CounterX = 0;
  Proved = 0;
  nLits = 0;
  for (Counter0 = 1; iVar1 = Gia_ManObjNum(p), Counter0 < iVar1; Counter0 = Counter0 + 1) {
    iVar1 = Gia_ObjIsHead(p,Counter0);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsConst(p,Counter0);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsNone(p,Counter0);
        if (iVar1 != 0) {
          nLits = nLits + 1;
        }
      }
      else {
        Proved = Proved + 1;
      }
    }
    else {
      CounterX = CounterX + 1;
    }
    Gia_ObjProved(p,Counter0);
  }
  iVar1 = Gia_ManCoNum(p);
  iVar2 = Gia_ManCiNum(p);
  iVar3 = Gia_ManAndNum(p);
  Abc_Print(1,"cst =%3d  cls =%6d  lit =%8d\n",(ulong)(uint)Proved,(ulong)(uint)CounterX,
            (ulong)(uint)(((iVar2 + iVar3) - CounterX) - (nLits - iVar1)));
  return;
}

Assistant:

void Gia_ManPrintStatsClasses( Gia_Man_t * p )
{
    int i, Counter = 0, Counter0 = 0, CounterX = 0, Proved = 0, nLits;
    for ( i = 1; i < Gia_ManObjNum(p); i++ )
    {
        if ( Gia_ObjIsHead(p, i) )
            Counter++;
        else if ( Gia_ObjIsConst(p, i) )
            Counter0++;
        else if ( Gia_ObjIsNone(p, i) )
            CounterX++;
        if ( Gia_ObjProved(p, i) )
            Proved++;
    }
    CounterX -= Gia_ManCoNum(p);
    nLits = Gia_ManCiNum(p) + Gia_ManAndNum(p) - Counter - CounterX;

//    Abc_Print( 1, "i/o/ff =%5d/%5d/%5d  ", Gia_ManPiNum(p), Gia_ManPoNum(p), Gia_ManRegNum(p) );
//    Abc_Print( 1, "and =%5d  ", Gia_ManAndNum(p) );
//    Abc_Print( 1, "lev =%3d  ", Gia_ManLevelNum(p) );
    Abc_Print( 1, "cst =%3d  cls =%6d  lit =%8d\n", Counter0, Counter, nLits );
}